

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O3

bool __thiscall rengine::SDLBackend::beginRender(SDLBackend *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  size_t sVar6;
  ostream *poVar7;
  char *__s;
  char *local_68;
  long local_60;
  char local_58 [16];
  char local_48 [8];
  char buffer [16];
  
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xc9,"virtual bool rengine::SDLBackend::beginRender()");
  }
  if (this->m_surface != (Surface *)0x0) {
    if (this->m_gl != (SDL_GLContext)0x0) {
      iVar4 = SDL_GL_MakeCurrent();
      if (iVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"W [",3);
        lVar5 = std::chrono::_V2::system_clock::now();
        auVar1 = SEXT816(lVar5 / 1000000000) * SEXT816(0x346dc5d63886594b);
        auVar2 = SEXT816(lVar5 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
        auVar3 = SEXT816(lVar5 / 1000) * SEXT816(0x20c49ba5e353f7cf);
        snprintf(local_48,0x10,"%4d.%03d %03d",
                 (ulong)(uint)((int)(lVar5 / 1000000000) +
                              ((int)(auVar1._8_8_ >> 0xb) - (auVar1._12_4_ >> 0x1f)) * -10000),
                 (ulong)(uint)((int)(lVar5 / 1000000) +
                              ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) * -1000),
                 (ulong)(uint)((int)(lVar5 / 1000) +
                              ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) * -1000));
        local_68 = local_58;
        sVar6 = strlen(local_48);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,local_48,local_48 + sVar6);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_68,local_60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]: ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"virtual bool rengine::SDLBackend::beginRender()",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"SDL_GL_MakeCurrent failed: ",0x1b);
        __s = (char *)SDL_GetError();
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
        }
        else {
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar6);
        }
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
      }
      return iVar4 == 0;
    }
    __assert_fail("m_gl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xcb,"virtual bool rengine::SDLBackend::beginRender()");
  }
  __assert_fail("m_surface",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                ,0xca,"virtual bool rengine::SDLBackend::beginRender()");
}

Assistant:

inline bool SDLBackend::beginRender()
{
    assert(m_window);
    assert(m_surface);
    assert(m_gl);
    int error = SDL_GL_MakeCurrent(m_window, m_gl);
    if (error != 0) {
        logw << "SDL_GL_MakeCurrent failed: " << SDL_GetError();
        return false;
    }
    return true;
}